

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::ImageCopyFromBuffer::submit
          (ImageCopyFromBuffer *this,SubmitContext *context)

{
  deUint64 dVar1;
  Context *this_00;
  DeviceInterface *pDVar2;
  VkCommandBuffer pVVar3;
  Handle<(vk::HandleType)8> *pHVar4;
  VkImage VVar5;
  undefined8 local_60;
  VkBufferImageCopy region;
  VkCommandBuffer commandBuffer;
  DeviceInterface *vkd;
  SubmitContext *context_local;
  ImageCopyFromBuffer *this_local;
  
  this_00 = SubmitContext::getContext(context);
  pDVar2 = Context::getDeviceInterface(this_00);
  pVVar3 = SubmitContext::getCommandBuffer(context);
  local_60 = 0;
  region.bufferOffset._0_4_ = 0;
  region.bufferOffset._4_4_ = 0;
  region.bufferRowLength = 1;
  region.bufferImageHeight = 0;
  region.imageSubresource.aspectMask = 0;
  region.imageSubresource.mipLevel = 1;
  region.imageSubresource.baseArrayLayer = 0;
  region.imageSubresource.layerCount = 0;
  region.imageOffset.x = 0;
  region.imageOffset.y = this->m_imageWidth;
  region.imageOffset.z = this->m_imageHeight;
  region.imageExtent.width = 1;
  region.imageExtent._4_8_ = pVVar3;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  dVar1 = pHVar4->m_internal;
  VVar5 = SubmitContext::getImage(context);
  (*pDVar2->_vptr_DeviceInterface[0x62])
            (pDVar2,pVVar3,dVar1,VVar5.m_internal,(ulong)this->m_imageLayout,1,&local_60);
  return;
}

Assistant:

void ImageCopyFromBuffer::submit (SubmitContext& context)
{
	const vk::DeviceInterface&	vkd				= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer	commandBuffer	= context.getCommandBuffer();
	const vk::VkBufferImageCopy	region			=
	{
		0,
		0, 0,
		{
			vk::VK_IMAGE_ASPECT_COLOR_BIT,
			0,	// mipLevel
			0,	// arrayLayer
			1	// layerCount
		},
		{ 0, 0, 0 },
		{
			(deUint32)m_imageWidth,
			(deUint32)m_imageHeight,
			1u
		}
	};

	vkd.cmdCopyBufferToImage(commandBuffer, *m_srcBuffer, context.getImage(), m_imageLayout, 1, &region);
}